

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

int mpz_cmp(__mpz_struct *a,__mpz_struct *b)

{
  long n;
  mp_size_t bsize;
  mp_size_t asize;
  __mpz_struct *b_local;
  __mpz_struct *a_local;
  
  n = (long)a->_mp_size;
  if (n == b->_mp_size) {
    if (n < 0) {
      a_local._4_4_ = mpn_cmp(b->_mp_d,a->_mp_d,-n);
    }
    else {
      a_local._4_4_ = mpn_cmp(a->_mp_d,b->_mp_d,n);
    }
  }
  else {
    a_local._4_4_ = 1;
    if (n < b->_mp_size) {
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

int
mpz_cmp (const mpz_t a, const mpz_t b)
{
  mp_size_t asize = a->_mp_size;
  mp_size_t bsize = b->_mp_size;

  if (asize != bsize)
    return (asize < bsize) ? -1 : 1;
  else if (asize >= 0)
    return mpn_cmp (a->_mp_d, b->_mp_d, asize);
  else
    return mpn_cmp (b->_mp_d, a->_mp_d, -asize);
}